

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O3

sc_uint_base * __thiscall sc_dt::sc_uint_base::operator=(sc_uint_base *this,sc_bv_base *a)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  
  uVar3 = this->m_len;
  uVar5 = a->m_len;
  if ((int)uVar3 < a->m_len) {
    uVar5 = uVar3;
  }
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  else {
    uVar6 = this->m_val;
    uVar7 = 0;
    do {
      uVar8 = uVar6 | 1L << (uVar7 & 0x3f);
      uVar6 = uVar6 & ~(1L << (uVar7 & 0x3f));
      if ((a->m_data[uVar7 >> 5 & 0x7ffffff] >> ((uint)uVar7 & 0x1f) & 1) != 0) {
        uVar6 = uVar8;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
    this->m_val = uVar6;
  }
  uVar6 = this->m_val;
  if ((int)uVar5 < (int)uVar3) {
    lVar4 = ((ulong)uVar3 - (ulong)uVar5) + -1;
    uVar7 = (ulong)uVar5;
    lVar15 = (ulong)uVar5 + 1;
    auVar14._8_8_ = 0xffffffffffffffff;
    auVar14._0_8_ = uVar6;
    auVar10._8_4_ = (int)lVar4;
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 2;
    do {
      auVar9 = auVar14;
      auVar14._0_8_ = ~(1L << uVar7) & auVar9._0_8_;
      auVar14._8_8_ = ~(1L << lVar15) & auVar9._8_8_;
      uVar7 = uVar7 + 2;
      lVar15 = lVar15 + 2;
      lVar1 = (((ulong)uVar3 - (ulong)uVar5) + 1 & 0xfffffffffffffffe) + lVar4;
      lVar4 = lVar4 + -2;
    } while (lVar1 != 4);
    lVar4 = -lVar4;
    auVar11._8_4_ = (int)lVar4;
    auVar11._0_8_ = lVar4;
    auVar11._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar10 = auVar10 ^ _DAT_0021c870;
    auVar12 = (auVar11 | _DAT_0021c860) ^ _DAT_0021c870;
    iVar16 = -(uint)(auVar10._0_4_ < auVar12._0_4_);
    iVar17 = -(uint)(auVar10._4_4_ < auVar12._4_4_);
    iVar18 = -(uint)(auVar10._8_4_ < auVar12._8_4_);
    iVar19 = -(uint)(auVar10._12_4_ < auVar12._12_4_);
    auVar20._4_4_ = iVar16;
    auVar20._0_4_ = iVar16;
    auVar20._8_4_ = iVar18;
    auVar20._12_4_ = iVar18;
    iVar16 = -(uint)(auVar12._4_4_ == auVar10._4_4_);
    iVar18 = -(uint)(auVar12._12_4_ == auVar10._12_4_);
    auVar12._4_4_ = iVar16;
    auVar12._0_4_ = iVar16;
    auVar12._8_4_ = iVar18;
    auVar12._12_4_ = iVar18;
    auVar13._4_4_ = iVar17;
    auVar13._0_4_ = iVar17;
    auVar13._8_4_ = iVar19;
    auVar13._12_4_ = iVar19;
    auVar13 = auVar13 | auVar12 & auVar20;
    auVar14 = ~auVar13 & auVar14 | auVar9 & auVar13;
    uVar6 = auVar14._8_8_ & auVar14._0_8_;
  }
  bVar2 = (byte)this->m_ulen;
  this->m_val = (uVar6 << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
  return this;
}

Assistant:

sc_uint_base&
sc_uint_base::operator = ( const sc_bv_base& a )
{
    int minlen = sc_min( m_len, a.length() );
    int i = 0;
    for( ; i < minlen; ++ i ) {
	set( i, a.get_bit( i ) );
    }
    for( ; i < m_len; ++ i ) {
	// zero extension
	set( i, 0 );
    }
    extend_sign();
    return *this;
}